

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memjrnlWrite(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  sqlite3_io_methods *psVar1;
  int iVar2;
  sqlite3_io_methods *psVar3;
  int local_6c;
  FileChunk *pNew;
  int iSpace;
  int iChunkOffset;
  FileChunk *pChunk;
  void *pvStack_48;
  int rc;
  u8 *zWrite;
  int nWrite;
  MemJournal *p;
  sqlite_int64 iOfst_local;
  int iAmt_local;
  void *zBuf_local;
  sqlite3_file *pJfd_local;
  
  pvStack_48 = zBuf;
  zWrite._4_4_ = iAmt;
  if ((*(int *)((long)&pJfd[1].pMethods + 4) < 1) ||
     (iAmt + iOfst <= (long)*(int *)((long)&pJfd[1].pMethods + 4))) {
    while (0 < zWrite._4_4_) {
      psVar1 = pJfd[5].pMethods;
      iVar2 = (int)((long)pJfd[4].pMethods % (long)*(int *)&pJfd[1].pMethods);
      if (zWrite._4_4_ < *(int *)&pJfd[1].pMethods - iVar2) {
        local_6c = zWrite._4_4_;
      }
      else {
        local_6c = *(int *)&pJfd[1].pMethods - iVar2;
      }
      if (iVar2 == 0) {
        psVar3 = (sqlite3_io_methods *)sqlite3_malloc(*(int *)&pJfd[1].pMethods + 8);
        if (psVar3 == (sqlite3_io_methods *)0x0) {
          return 0xc0a;
        }
        *(undefined8 *)psVar3 = 0;
        if (psVar1 == (sqlite3_io_methods *)0x0) {
          pJfd[3].pMethods = psVar3;
        }
        else {
          *(sqlite3_io_methods **)psVar1 = psVar3;
        }
        pJfd[5].pMethods = psVar3;
      }
      memcpy((void *)((long)&(pJfd[5].pMethods)->xClose + (long)iVar2),pvStack_48,(long)local_6c);
      pvStack_48 = (void *)((long)pvStack_48 + (long)local_6c);
      zWrite._4_4_ = zWrite._4_4_ - local_6c;
      pJfd[4].pMethods =
           (sqlite3_io_methods *)((long)&(pJfd[4].pMethods)->iVersion + (long)local_6c);
    }
    *(int *)&pJfd[2].pMethods = iAmt + (int)iOfst;
    pJfd_local._4_4_ = 0;
  }
  else {
    pChunk._4_4_ = memjrnlCreateFile((MemJournal *)pJfd);
    if (pChunk._4_4_ == 0) {
      pChunk._4_4_ = sqlite3OsWrite(pJfd,zBuf,iAmt,iOfst);
    }
    pJfd_local._4_4_ = pChunk._4_4_;
  }
  return pJfd_local._4_4_;
}

Assistant:

static int memjrnlWrite(
  sqlite3_file *pJfd,    /* The journal file into which to write */
  const void *zBuf,      /* Take data to be written from here */
  int iAmt,              /* Number of bytes to write */
  sqlite_int64 iOfst     /* Begin writing at this offset into the file */
){
  MemJournal *p = (MemJournal *)pJfd;
  int nWrite = iAmt;
  u8 *zWrite = (u8 *)zBuf;

  /* If the file should be created now, create it and write the new data
  ** into the file on disk. */
  if( p->nSpill>0 && (iAmt+iOfst)>p->nSpill ){
    int rc = memjrnlCreateFile(p);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsWrite(pJfd, zBuf, iAmt, iOfst);
    }
    return rc;
  }

  /* If the contents of this write should be stored in memory */
  else{
    /* An in-memory journal file should only ever be appended to. Random
    ** access writes are not required. The only exception to this is when
    ** the in-memory journal is being used by a connection using the
    ** atomic-write optimization. In this case the first 28 bytes of the
    ** journal file may be written as part of committing the transaction. */ 
    assert( iOfst==p->endpoint.iOffset || iOfst==0 );
#if defined(SQLITE_ENABLE_ATOMIC_WRITE) \
 || defined(SQLITE_ENABLE_BATCH_ATOMIC_WRITE)
    if( iOfst==0 && p->pFirst ){
      assert( p->nChunkSize>iAmt );
      memcpy((u8*)p->pFirst->zChunk, zBuf, iAmt);
    }else
#else
    assert( iOfst>0 || p->pFirst==0 );
#endif
    {
      while( nWrite>0 ){
        FileChunk *pChunk = p->endpoint.pChunk;
        int iChunkOffset = (int)(p->endpoint.iOffset%p->nChunkSize);
        int iSpace = MIN(nWrite, p->nChunkSize - iChunkOffset);

        if( iChunkOffset==0 ){
          /* New chunk is required to extend the file. */
          FileChunk *pNew = sqlite3_malloc(fileChunkSize(p->nChunkSize));
          if( !pNew ){
            return SQLITE_IOERR_NOMEM_BKPT;
          }
          pNew->pNext = 0;
          if( pChunk ){
            assert( p->pFirst );
            pChunk->pNext = pNew;
          }else{
            assert( !p->pFirst );
            p->pFirst = pNew;
          }
          p->endpoint.pChunk = pNew;
        }

        memcpy((u8*)p->endpoint.pChunk->zChunk + iChunkOffset, zWrite, iSpace);
        zWrite += iSpace;
        nWrite -= iSpace;
        p->endpoint.iOffset += iSpace;
      }
      p->nSize = iAmt + iOfst;
    }
  }

  return SQLITE_OK;
}